

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::assignToInterface(HlslParseContext *this,TVariable *variable)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer ppTVar4;
  anon_class_8_1_8991fb9c assignLocation;
  anon_class_8_1_8991fb9c local_28;
  key_type_conflict2 local_20;
  
  local_28.this = this;
  iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xf])(variable);
  bVar1 = wasFlattened(this,CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xf])(variable);
    local_20 = CONCAT44(extraout_var_00,iVar2);
    pmVar3 = std::
             map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
             ::operator[](&(this->flattenMap).
                           super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
                          ,&local_20);
    for (ppTVar4 = (pmVar3->members).
                   super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                   .
                   super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppTVar4 !=
        (pmVar3->members).
        super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
        super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppTVar4 = ppTVar4 + 1) {
      assignToInterface::anon_class_8_1_8991fb9c::operator()(&local_28,*ppTVar4);
    }
  }
  else {
    iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xf])(variable);
    bVar1 = wasSplit(this,CONCAT44(extraout_var_01,iVar2));
    if (bVar1) {
      iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xf])(variable);
      variable = getSplitNonIoVar(this,CONCAT44(extraout_var_02,iVar2));
    }
    assignToInterface::anon_class_8_1_8991fb9c::operator()(&local_28,variable);
  }
  return;
}

Assistant:

void HlslParseContext::assignToInterface(TVariable& variable)
{
    const auto assignLocation = [&](TVariable& variable) {
        TType& type = variable.getWritableType();
        if (!type.isStruct() || type.getStruct()->size() > 0) {
            TQualifier& qualifier = type.getQualifier();
            if (qualifier.storage == EvqVaryingIn || qualifier.storage == EvqVaryingOut) {
                if (qualifier.builtIn == EbvNone && !qualifier.hasLocation()) {
                    // Strip off the outer array dimension for those having an extra one.
                    int size;
                    if (type.isArray() && qualifier.isArrayedIo(language)) {
                        TType elementType(type, 0);
                        size = intermediate.computeTypeLocationSize(elementType, language);
                    } else
                        size = intermediate.computeTypeLocationSize(type, language);

                    if (qualifier.storage == EvqVaryingIn) {
                        variable.getWritableType().getQualifier().layoutLocation = nextInLocation;
                        nextInLocation += size;
                    } else {
                        variable.getWritableType().getQualifier().layoutLocation = nextOutLocation;
                        nextOutLocation += size;
                    }
                }
                trackLinkage(variable);
            }
        }
    };

    if (wasFlattened(variable.getUniqueId())) {
        auto& memberList = flattenMap[variable.getUniqueId()].members;
        for (auto member = memberList.begin(); member != memberList.end(); ++member)
            assignLocation(**member);
    } else if (wasSplit(variable.getUniqueId())) {
        TVariable* splitIoVar = getSplitNonIoVar(variable.getUniqueId());
        assignLocation(*splitIoVar);
    } else {
        assignLocation(variable);
    }
}